

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

void __thiscall SQASTWriter::writeOptions(SQASTWriter *this)

{
  OutputStream *in_RDI;
  int8_t in_stack_ffffffffffffffef;
  
  OutputStream::writeInt8(in_RDI,in_stack_ffffffffffffffef);
  OutputStream::writeInt8(in_RDI,in_stack_ffffffffffffffef);
  OutputStream::writeInt8(in_RDI,in_stack_ffffffffffffffef);
  OutputStream::writeInt8(in_RDI,in_stack_ffffffffffffffef);
  return;
}

Assistant:

void SQASTWriter::writeOptions() {
  stream->writeInt8(VERSION);
  stream->writeInt8(OP_DELTA);
  stream->writeInt8(sizeof(SQInteger));
  stream->writeInt8(sizeof(SQFloat));
}